

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall Client::Start(Client *this)

{
  int32_t interval;
  CppNet *this_00;
  int local_70;
  int i;
  Client *local_60;
  code *local_58;
  undefined8 local_50;
  type local_48;
  user_timer_call_back local_30;
  Client *local_10;
  Client *this_local;
  
  this_00 = this->_net;
  interval = this->_timeout;
  local_58 = HandleTimeout;
  local_50 = 0;
  local_60 = this;
  local_10 = this;
  std::bind<void(Client::*)(void*),Client*,std::_Placeholder<1>const&>
            (&local_48,(offset_in_Client_to_subr *)&local_58,&local_60,
             (_Placeholder<1> *)&std::placeholders::_1);
  std::function<void(void*)>::
  function<std::_Bind<void(Client::*(Client*,std::_Placeholder<1>))(void*)>,void>
            ((function<void(void*)> *)&local_30,&local_48);
  cppnet::CppNet::AddTimer(this_00,interval,&local_30,(void *)0x0,false);
  std::function<void_(void_*)>::~function(&local_30);
  for (local_70 = 0; local_70 < this->_session_count; local_70 = local_70 + 1) {
    cppnet::CppNet::Connection(this->_net,&this->_ip,(uint16_t)this->_port);
  }
  return;
}

Assistant:

void Start() {
        _net->AddTimer(_timeout, std::bind(&Client::HandleTimeout, this, std::placeholders::_1), nullptr);

        for (int i = 0; i < _session_count; ++i) {
            _net->Connection(_ip, _port);
        }
    }